

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecpp.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  long in_RSI;
  int in_EDI;
  char *dealloc;
  fppTag *tagptr;
  int i;
  fppTag tags [40];
  void *local_2b0;
  undefined4 *puVar5;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 uVar6;
  fppTag **in_stack_fffffffffffffd68;
  undefined4 local_288 [161];
  int local_4;
  
  uVar6 = 4;
  iVar2 = 0x10cce4;
  puVar5 = local_288;
  cVar1 = GetPrefs(in_stack_fffffffffffffd68,
                   (char **)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  if (cVar1 == '\0') {
    iVar2 = SetOptions(iVar2,(char **)in_stack_fffffffffffffd68,
                       (fppTag **)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else if (in_EDI - iVar2 < 3) {
      *puVar5 = 0xc;
      *(code **)(puVar5 + 2) = own_input;
      puVar5 = puVar5 + 4;
      if (iVar2 < in_EDI) {
        iVar3 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-");
        if (iVar3 == 0) {
          if (display != '\0') {
            fprintf(_stderr,"cpp: input: [stdin]\n");
          }
        }
        else {
          pFVar4 = freopen(*(char **)(in_RSI + (long)iVar2 * 8),"r",_stdin);
          if (pFVar4 == (FILE *)0x0) {
            perror(*(char **)(in_RSI + (long)iVar2 * 8));
            fprintf(_stderr,"Can\'t open input file \"%s\"",
                    *(undefined8 *)(in_RSI + (long)iVar2 * 8));
            return -2;
          }
          *puVar5 = 0xb;
          *(undefined8 *)(puVar5 + 2) = *(undefined8 *)(in_RSI + (long)iVar2 * 8);
          puVar5 = puVar5 + 4;
          if (display != '\0') {
            fprintf(_stderr,"cpp: input: %s\n",*(undefined8 *)(in_RSI + (long)iVar2 * 8));
          }
        }
        iVar2 = iVar2 + 1;
      }
      else if (display != '\0') {
        fprintf(_stderr,"cpp: input: [stdin]\n");
      }
      if (iVar2 < in_EDI) {
        iVar3 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-");
        if (iVar3 == 0) {
          if (display != '\0') {
            fprintf(_stderr,"cpp: output: [stdout]\n");
          }
        }
        else {
          pFVar4 = freopen(*(char **)(in_RSI + (long)iVar2 * 8),"w",_stdout);
          if (pFVar4 == (FILE *)0x0) {
            perror(*(char **)(in_RSI + (long)iVar2 * 8));
            fprintf(_stderr,"Can\'t open output file \"%s\"",
                    *(undefined8 *)(in_RSI + (long)iVar2 * 8));
            return -1;
          }
          if (display != '\0') {
            fprintf(_stderr,"cpp: output: %s\n",*(undefined8 *)(in_RSI + (long)iVar2 * 8));
          }
        }
      }
      else if (display != '\0') {
        fprintf(_stderr,"cpp: output: [stdout]\n");
      }
      *puVar5 = 0xd;
      *(code **)(puVar5 + 2) = own_output;
      puVar5[4] = 0x10;
      *(code **)(puVar5 + 6) = own_error;
      puVar5[8] = 0;
      *(undefined8 *)(puVar5 + 10) = 0;
      fppPreProcess((fppTag *)(puVar5 + 0xc));
      if (local_2b0 != (void *)0x0) {
        free(local_2b0);
      }
      local_4 = 0;
    }
    else {
      printf("Too many file arguments. Usage: cpp [options] [input [output]]\n");
      local_4 = -1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
  struct fppTag tags[MAX_TAGS];
  int i;
  struct fppTag *tagptr = tags;
  char *dealloc;

  /*
   * Append system-specific directories to the include directory list.
   * The include directories will be searched through in the same order
   * as you add them in the taglist!
   * The directory _must_ end with a proper directory speparator!
   */  

  tagptr->tag=FPPTAG_INCLUDE_DIR;
#if defined (AMIGA)
  tagptr->data = "INCLUDE:";
#elif defined (OS9)
  tagptr->data = "/dd/defs/";
#elif defined (WIN32)
  tagptr->data = "";
#else
  tagptr->data = PKGDATADIR;
#endif
  tagptr++;

  if(GetPrefs(&tagptr, &dealloc))
    return(0);

  if( !(i = SetOptions(argc, argv, &tagptr)))
    return(0);
  
  if (argc - i >2) {
    printf("Too many file arguments. Usage: cpp [options] [input [output]]\n");
    return(-1);
  }

  tagptr->tag=FPPTAG_INPUT;
  tagptr->data=(void *)own_input;
  tagptr++;

  if(i<argc) {
    /*
     * Open input file, "-" means use stdin.
     */
    if (strcmp(argv[i], "-")) {
      if (freopen(argv[i], "r", stdin) == NULL) {
	perror(argv[i]);
	fprintf(stderr, "Can't open input file \"%s\"", argv[i]);
	return(-2);
      }
      tagptr->tag=FPPTAG_INPUT_NAME;
      tagptr->data=argv[i];
      tagptr++;
      if(display)
	fprintf(stderr, "cpp: input: %s\n", argv[i]);
    } else				/* Else, just get stdin 	*/
      if(display)
	fprintf(stderr, "cpp: input: [stdin]\n");
    i++;
  } else
    if(display)
      fprintf(stderr, "cpp: input: [stdin]\n");

  if(i<argc) {
    /*
     * Get output file, "-" means use stdout.
     */
    if (strcmp(argv[i], "-")) {
      if (freopen(argv[i], "w", stdout) == NULL) {
	perror(argv[i]);
	fprintf(stderr, "Can't open output file \"%s\"", argv[i]);
	return(-1);
      }
      if(display)
	fprintf(stderr, "cpp: output: %s\n", argv[i]);
    } else
      if(display)
	fprintf(stderr, "cpp: output: [stdout]\n");
  } else
    if(display)
      fprintf(stderr, "cpp: output: [stdout]\n");

  tagptr->tag=FPPTAG_OUTPUT;
  tagptr->data=(void *)own_output;
  tagptr++;

  tagptr->tag=FPPTAG_ERROR;
  tagptr->data=(void *)own_error;
  tagptr++;

  /* The LAST tag: */

  tagptr->tag=FPPTAG_END;
  tagptr->data=0;
  tagptr++;

#if defined(SHARED) && defined(AMIGA)
  if(!(FPPBase=OpenLibrary(FPPNAME, 1))) {
    printf("Error opening %s!\n", FPPNAME);
    return(-1);
  }
#endif
  fppPreProcess(tags);

#if defined(SHARED) && defined(AMIGA)
  CloseLibrary((struct Library *)FPPBase);
#endif
  /*
   * Preprocess ready!
   */

  if( dealloc )
    free( dealloc );

  return(0);
}